

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void test<long>(long expected,string *value)

{
  size_type sVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  size_type sVar8;
  byte bVar9;
  undefined8 in_R8;
  undefined7 uVar11;
  char *pcVar10;
  uint uVar12;
  char *in_R9;
  AssertHelper local_60;
  AssertHelper local_58;
  long result2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertionResult gtest_ar;
  undefined1 local_30 [16];
  long expected_local;
  long result;
  
  pcVar10 = (char *)value->_M_string_length;
  if (pcVar10 == (char *)0x0) {
LAB_0011ce2e:
    cVar2 = '\0';
    result = 0;
  }
  else {
    pcVar4 = (value->_M_dataplus)._M_p;
    pcVar5 = pcVar4 + (long)pcVar10;
    if (*pcVar4 == '-') {
      if (pcVar10 == (char *)0x1) goto LAB_0011ce2e;
      pcVar4 = pcVar4 + 1;
      result = (long)(char *)0x0;
      do {
        uVar12 = (int)CONCAT71((int7)((ulong)in_R8 >> 8),*pcVar4) - 0x3a;
        in_R9 = (char *)(ulong)uVar12;
        if ((byte)uVar12 < 0xf6) {
LAB_0011cae8:
          in_R8 = 0;
          pcVar7 = (char *)result;
        }
        else {
          bVar9 = *pcVar4 - 0x30;
          if ((result < -0xccccccccccccccc) ||
             (in_R9 = (char *)(ulong)CONCAT31((int3)(uVar12 >> 8),
                                              (char *)result == (char *)0xf333333333333334),
             (char *)result == (char *)0xf333333333333334 && 8 < bVar9)) goto LAB_0011cae8;
          lVar6 = result * 10;
          in_R8 = 1;
          result = (long)pcVar10;
          pcVar7 = (char *)(lVar6 - (ulong)bVar9);
        }
        if ((char)in_R8 == '\0') goto LAB_0011cb5a;
        pcVar4 = pcVar4 + 1;
        pcVar10 = (char *)result;
        result = (long)pcVar7;
      } while (pcVar4 < pcVar5);
    }
    else {
      if (*pcVar4 == '+') {
        pcVar4 = pcVar4 + 1;
      }
      if (pcVar4 == pcVar5) goto LAB_0011ce2e;
      result = (long)(char *)0x0;
      do {
        uVar11 = (undefined7)((ulong)in_R8 >> 8);
        uVar12 = (int)CONCAT71(uVar11,*pcVar4) - 0x3a;
        in_R9 = (char *)(ulong)uVar12;
        if ((byte)uVar12 < 0xf6) {
LAB_0011cb52:
          in_R8 = 0;
          pcVar7 = (char *)result;
        }
        else {
          bVar9 = *pcVar4 - 0x30;
          if ((0xccccccccccccccc < result) ||
             (in_R9 = (char *)(ulong)CONCAT31((int3)(uVar12 >> 8),
                                              (char *)result == (char *)0xccccccccccccccc),
             (char *)result == (char *)0xccccccccccccccc && 7 < bVar9)) goto LAB_0011cb52;
          in_R9 = (char *)(result * 10);
          in_R8 = CONCAT71(uVar11,1);
          result = (long)pcVar10;
          pcVar7 = in_R9 + bVar9;
        }
        if ((char)in_R8 == '\0') goto LAB_0011cb5a;
        pcVar4 = pcVar4 + 1;
        pcVar10 = (char *)result;
        result = (long)pcVar7;
      } while (pcVar4 < pcVar5);
    }
    cVar2 = '\x01';
  }
  goto LAB_0011cb63;
LAB_0011cb5a:
  cVar2 = '\0';
LAB_0011cb63:
  result2 = CONCAT71(result2._1_7_,cVar2);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  expected_local = expected;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&result2,(AssertionResult *)0x1434ac,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x18,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_30) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"expected","result",&expected_local,&result);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&result2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x19,pcVar10);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&result2);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (result2 != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (result2 != 0)) {
        (**(code **)(*(long *)result2 + 8))();
      }
      result2 = 0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar1 = value->_M_string_length;
  if (sVar1 != 0) {
    pcVar10 = (value->_M_dataplus)._M_p;
    if (*pcVar10 == '-') {
      if (sVar1 != 1) {
        sVar8 = 1;
        result2 = 0;
        do {
          result2 = (result2 * 10 - (long)pcVar10[sVar8]) + 0x30;
          sVar8 = sVar8 + 1;
        } while (sVar1 != sVar8);
        goto LAB_0011cd00;
      }
    }
    else {
      pcVar5 = pcVar10 + sVar1;
      if (*pcVar10 == '+') {
        pcVar10 = pcVar10 + 1;
      }
      if (pcVar10 != pcVar5) {
        result2 = 0;
        do {
          cVar2 = *pcVar10;
          pcVar10 = pcVar10 + 1;
          result2 = result2 * 10 + (long)cVar2 + -0x30;
        } while (pcVar10 != pcVar5);
        goto LAB_0011cd00;
      }
    }
  }
  result2 = 0;
LAB_0011cd00:
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"expected","result2",&expected_local,&result2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x1c,pcVar10);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

static void test(T expected, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_TRUE(valid);
  ASSERT_EQ(expected, result);
  
  T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
  ASSERT_EQ(expected, result2);
}